

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

TIntermTyped * __thiscall
glslang::TParseContext::handleDotDereference
          (TParseContext *this,TSourceLoc *loc,TIntermTyped *base,TString *field)

{
  bool bVar1;
  EShSource EVar2;
  TIntermediate *pTVar3;
  TString name;
  TString name_00;
  TString structName_00;
  TString structName_01;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  TIntermTyped *pTVar7;
  TIntermTyped *pTVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar9;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  TType *this_00;
  undefined4 extraout_var_08;
  TTypeList *pTVar10;
  pointer pTVar11;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar12;
  undefined4 extraout_var_09;
  long *plVar13;
  TIntermTyped *pTVar14;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  long lVar15;
  TIntermConstantUnion *index;
  undefined4 extraout_var_16;
  TParseContext *this_01;
  undefined4 extraout_var_18;
  char *pcVar16;
  pointer pcVar17;
  char *pcVar18;
  TString *pTVar19;
  _func_int **pp_Var20;
  long lVar21;
  undefined8 in_stack_fffffffffffffe68;
  TIntermTyped *base_local;
  pool_allocator<char> local_178;
  pool_allocator<char> local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  local_168 [2];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_140 [40];
  TString structName;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_80 [40];
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> local_58 [40];
  undefined4 extraout_var_07;
  undefined4 extraout_var_10;
  undefined4 extraout_var_17;
  
  base_local = base;
  variableCheck(this,&base_local);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(field,"length");
  pTVar7 = base_local;
  iVar5 = (*(base_local->super_TIntermNode)._vptr_TIntermNode[0x2a])(base_local);
  if (iVar4 != 0) {
    if ((char)iVar5 == '\0') {
      iVar4 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar7);
      if ((*(byte *)(CONCAT44(extraout_var,iVar4) + 10) & 0x60) == 0) {
        iVar4 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x2b])(pTVar7);
        if ((((char)iVar4 == '\0') &&
            (iVar4 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x2c])(pTVar7),
            (char)iVar4 == '\0')) ||
           ((iVar4 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x2e])(pTVar7),
            (char)iVar4 == '\0' &&
            ((iVar4 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x2f])(pTVar7),
             (char)iVar4 == '\0' &&
             (iVar4 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x20])(pTVar7), iVar4 != 0xc))
            )))) {
          iVar4 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x2d])(pTVar7);
          pTVar8 = pTVar7;
          if (((char)iVar4 == '\0') &&
             (iVar4 = (*(pTVar7->type)._vptr_TType[7])(&pTVar7->type), iVar4 != 0x12)) {
            pcVar17 = (field->_M_dataplus)._M_p;
            iVar4 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar7);
            pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            EVar2 = pTVar3->source;
            bVar1 = pTVar3->enhancedMsgs;
            local_170.allocator = GetThreadPoolAllocator();
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       local_168[0]._M_local_buf,"",&local_170);
            local_178.allocator = GetThreadPoolAllocator();
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>(local_80,"",&local_178);
            name_00._M_dataplus._M_p = (pointer)local_80;
            name_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_168;
            name_00._M_string_length = in_stack_fffffffffffffe68;
            name_00.field_2._M_allocated_capacity = (size_type)loc;
            name_00.field_2._8_8_ = pcVar17;
            structName_01._M_dataplus._M_p = (pointer)local_178.allocator;
            structName_01._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)base_local;
            structName_01._M_string_length = (size_type)local_170.allocator;
            structName_01.field_2 = local_168[0];
            TType::getCompleteString
                      (&structName,(TType *)CONCAT44(extraout_var_14,iVar4),
                       (bool)(EVar2 == EShSourceGlsl & bVar1),true,true,true,name_00,structName_01);
            pp_Var20 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar16 = "does not apply to this type:";
            pcVar18 = structName._M_dataplus._M_p;
          }
          else {
            iVar4 = (*(pTVar7->type)._vptr_TType[7])(&pTVar7->type);
            iVar5 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar7);
            this_00 = (TType *)CONCAT44(extraout_var_07,iVar5);
            if (iVar4 == 0x12) {
              iVar4 = (*this_00->_vptr_TType[0x15])(this_00);
              this_00 = (TType *)CONCAT44(extraout_var_08,iVar4);
            }
            pTVar10 = TType::getStruct(this_00);
            pTVar11 = (pTVar10->
                      super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                      super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (0 < (int)((ulong)((long)(pTVar10->
                                        super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                        ).
                                        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar11)
                         >> 5)) {
              lVar21 = 0;
              lVar9 = 0;
              do {
                pbVar12 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)(**(code **)(**(long **)((long)&pTVar11->type + lVar21) + 0x30))();
                pTVar19 = field;
                iVar4 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        compare(pbVar12,field);
                if (iVar4 == 0) {
                  if ((((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan == 0)
                      || ((this->super_TParseContextBase).super_TParseVersions.spvVersion.
                          vulkanRelaxed != true)) ||
                     (pTVar8 = vkRelaxedRemapDotDereference
                                         (this,(TSourceLoc *)pTVar19,pTVar7,
                                          *(TType **)
                                           ((long)&((pTVar10->
                                                                                                        
                                                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                  ).
                                                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->type +
                                           lVar21),field), pTVar8 == pTVar7)) {
                    iVar4 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar7);
                    lVar15 = (**(code **)(*(long *)CONCAT44(extraout_var_15,iVar4) + 0x58))
                                       ((long *)CONCAT44(extraout_var_15,iVar4));
                    iVar4 = (int)lVar9;
                    if ((*(ulong *)(lVar15 + 8) & 0x10000007f) == 2) {
                      pTVar8 = TIntermediate::foldDereference
                                         ((this->super_TParseContextBase).super_TParseVersions.
                                          intermediate,pTVar7,iVar4,loc);
                    }
                    else {
                      blockMemberExtensionCheck(this,loc,pTVar7,iVar4,field);
                      index = TIntermediate::addConstantUnion
                                        ((this->super_TParseContextBase).super_TParseVersions.
                                         intermediate,iVar4,loc,false);
                      pTVar8 = TIntermediate::addIndex
                                         ((this->super_TParseContextBase).super_TParseVersions.
                                          intermediate,EOpIndexDirectStruct,pTVar7,
                                          &index->super_TIntermTyped,loc);
                      (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0x1d])
                                (pTVar8,*(undefined8 *)
                                         ((long)&((pTVar10->
                                                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                  ).
                                                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->type +
                                         lVar21));
                      lVar9 = (**(code **)(**(long **)((long)&((pTVar10->
                                                                                                                              
                                                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                  ).
                                                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->type +
                                                  lVar21) + 0x50))();
                      uVar6 = *(uint *)(lVar9 + 8) & 0x7f;
                      if ((uVar6 - 0x14 < 0xb) || (uVar6 - 3 < 4)) {
                        std::
                        _Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
                        ::
                        _M_insert_unique<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const&>
                                  ((_Rb_tree<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::_Identity<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::less<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,std::allocator<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
                                    *)&((this->super_TParseContextBase).super_TParseVersions.
                                       intermediate)->ioAccessed,field);
                      }
                    }
                  }
                  iVar4 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x21])(pTVar7);
                  iVar5 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0x1f])(pTVar8);
                  this_01 = (TParseContext *)CONCAT44(extraout_var_17,iVar5);
                  iVar5 = (*(this_01->super_TParseContextBase).super_TParseVersions.
                            _vptr_TParseVersions[10])();
                  inheritMemoryQualifiers
                            (this_01,(TQualifier *)CONCAT44(extraout_var_16,iVar4),
                             (TQualifier *)CONCAT44(extraout_var_18,iVar5));
                  goto LAB_004a1f52;
                }
                lVar9 = lVar9 + 1;
                pTVar11 = (pTVar10->
                          super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ).
                          super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                lVar21 = lVar21 + 0x20;
              } while (lVar9 < (int)((ulong)((long)(pTVar10->
                                                                                                      
                                                  super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                  ).
                                                  super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)pTVar11) >> 5));
            }
            iVar4 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0xc])(pTVar7);
            lVar9 = CONCAT44(extraout_var_09,iVar4);
            pTVar14 = pTVar7;
            while (lVar9 == 0) {
              iVar4 = (*(pTVar14->super_TIntermNode)._vptr_TIntermNode[8])(pTVar14);
              plVar13 = (long *)CONCAT44(extraout_var_10,iVar4);
              if (plVar13 == (long *)0x0) break;
              pTVar14 = (TIntermTyped *)(**(code **)(*plVar13 + 400))(plVar13);
              iVar4 = (*(pTVar14->super_TIntermNode)._vptr_TIntermNode[0xc])(pTVar14);
              lVar9 = CONCAT44(extraout_var_11,iVar4);
            }
            iVar4 = (*(pTVar14->super_TIntermNode)._vptr_TIntermNode[0xc])(pTVar14);
            if (CONCAT44(extraout_var_12,iVar4) != 0) {
              structName._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
              structName._M_string_length = 0;
              structName.field_2._M_local_buf[0] = '\0';
              structName._M_dataplus._M_p = (pointer)&structName.field_2;
              pbVar12 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        append(&structName,"\'");
              iVar4 = (*(pTVar14->super_TIntermNode)._vptr_TIntermNode[0xc])(pTVar14);
              lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar4) + 400))
                                ((long *)CONCAT44(extraout_var_13,iVar4));
              pbVar12 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        append(pbVar12,*(char **)(lVar9 + 8));
              std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::append
                        (pbVar12,"\'");
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,loc,"no such field in structure",(field->_M_dataplus)._M_p,
                         structName._M_dataplus._M_p);
              pTVar7 = base_local;
              goto LAB_004a1f52;
            }
            pcVar17 = (field->_M_dataplus)._M_p;
            pp_Var20 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
            pcVar16 = "no such field in structure";
            pcVar18 = "";
          }
          (*pp_Var20[0x2d])(this,loc,pcVar16,pcVar17,pcVar18);
        }
        else {
          pTVar8 = handleDotSwizzle(this,loc,pTVar7,field);
        }
LAB_004a1f52:
        iVar4 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x21])(pTVar7);
        if ((*(byte *)(CONCAT44(extraout_var_00,iVar4) + 0xc) & 0x10) != 0) {
          iVar4 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0x1f])(pTVar8);
          lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x50))
                            ((long *)CONCAT44(extraout_var_01,iVar4));
          *(ulong *)(lVar9 + 8) = *(ulong *)(lVar9 + 8) | 0x1000000000;
          pTVar7 = base_local;
        }
        iVar4 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x21])(pTVar7);
        if ((*(byte *)(CONCAT44(extraout_var_02,iVar4) + 0xc) & 2) == 0) {
          return pTVar8;
        }
        iVar4 = (*(pTVar8->super_TIntermNode)._vptr_TIntermNode[0x1f])(pTVar8);
        lVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar4) + 0x50))
                          ((long *)CONCAT44(extraout_var_03,iVar4));
        *(ulong *)(lVar9 + 8) = *(ulong *)(lVar9 + 8) | 0x200000000;
        return pTVar8;
      }
      structName._M_dataplus._M_p = (field->_M_dataplus)._M_p;
      pp_Var20 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar18 = "cannot apply to a cooperative matrix type:";
    }
    else {
      structName._M_dataplus._M_p = (field->_M_dataplus)._M_p;
      pp_Var20 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar18 = "cannot apply to an array:";
    }
    pcVar16 = ".";
LAB_004a1e1b:
    (*pp_Var20[0x2d])(this,loc,pcVar18,pcVar16,structName._M_dataplus._M_p);
    return pTVar7;
  }
  if ((char)iVar5 == '\0') {
    iVar4 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x2b])(pTVar7);
    if (((char)iVar4 == '\0') &&
       (iVar4 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x29])(pTVar7), (char)iVar4 == '\0')
       ) {
      iVar4 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar7);
      if (((*(byte *)(CONCAT44(extraout_var_04,iVar4) + 10) & 0x60) == 0) &&
         (iVar4 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar7),
         (*(byte *)(CONCAT44(extraout_var_05,iVar4) + 0xb) & 8) == 0)) {
        pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        EVar2 = pTVar3->source;
        bVar1 = pTVar3->enhancedMsgs;
        pcVar16 = (field->_M_dataplus)._M_p;
        iVar4 = (*(pTVar7->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar7);
        local_170.allocator = GetThreadPoolAllocator();
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>(local_140,"",&local_170);
        local_178.allocator = GetThreadPoolAllocator();
        std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
        basic_string<glslang::std::allocator<char>>(local_58,"",&local_178);
        name._M_dataplus._M_p = (pointer)local_58;
        name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)local_140;
        name._M_string_length = in_stack_fffffffffffffe68;
        name.field_2._M_allocated_capacity = (size_type)loc;
        name.field_2._8_8_ = pcVar16;
        structName_00._M_dataplus._M_p = (pointer)local_178.allocator;
        structName_00._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)base_local;
        structName_00._M_string_length = (size_type)local_170.allocator;
        structName_00.field_2 = local_168[0];
        TType::getCompleteString
                  (&structName,(TType *)CONCAT44(extraout_var_06,iVar4),
                   (bool)(EVar2 == EShSourceGlsl & bVar1),true,true,true,name,structName_00);
        pp_Var20 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar18 = "does not operate on this type:";
        goto LAB_004a1e1b;
      }
      goto LAB_004a1e86;
    }
    pcVar16 = ".length() on vectors and matrices";
    TParseVersions::requireProfile
              ((TParseVersions *)this,loc,-9,".length() on vectors and matrices");
    pcVar18 = "GL_ARB_shading_language_420pack";
    iVar5 = -9;
    iVar4 = 0x1a4;
  }
  else {
    pcVar16 = ".length";
    TParseVersions::profileRequires
              ((TParseVersions *)this,loc,1,0x78,"GL_3DL_array_objects",".length");
    iVar5 = 8;
    iVar4 = 300;
    pcVar18 = (char *)0x0;
  }
  TParseVersions::profileRequires((TParseVersions *)this,loc,iVar5,iVar4,pcVar18,pcVar16);
LAB_004a1e86:
  pTVar3 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
  TType::TType((TType *)&structName,EbtInt,EvqTemporary,1,0,0,false);
  pTVar7 = TIntermediate::addMethod(pTVar3,pTVar7,(TType *)&structName,field,loc);
  return pTVar7;
}

Assistant:

TIntermTyped* TParseContext::handleDotDereference(const TSourceLoc& loc, TIntermTyped* base, const TString& field)
{
    variableCheck(base);

    //
    // .length() can't be resolved until we later see the function-calling syntax.
    // Save away the name in the AST for now.  Processing is completed in
    // handleLengthMethod().
    //
    if (field == "length") {
        if (base->isArray()) {
            profileRequires(loc, ENoProfile, 120, E_GL_3DL_array_objects, ".length");
            profileRequires(loc, EEsProfile, 300, nullptr, ".length");
        } else if (base->isVector() || base->isMatrix()) {
            const char* feature = ".length() on vectors and matrices";
            requireProfile(loc, ~EEsProfile, feature);
            profileRequires(loc, ~EEsProfile, 420, E_GL_ARB_shading_language_420pack, feature);
        } else if (!base->getType().isCoopMat() && !base->getType().isCoopVecNV()) {
            bool enhanced = intermediate.getEnhancedMsgs();
            error(loc, "does not operate on this type:", field.c_str(), base->getType().getCompleteString(enhanced).c_str());
            return base;
        }

        return intermediate.addMethod(base, TType(EbtInt), &field, loc);
    }

    // It's not .length() if we get to here.

    if (base->isArray()) {
        error(loc, "cannot apply to an array:", ".", field.c_str());

        return base;
    }

    if (base->getType().isCoopMat()) {
        error(loc, "cannot apply to a cooperative matrix type:", ".", field.c_str());
        return base;
    }

    // It's neither an array nor .length() if we get here,
    // leaving swizzles and struct/block dereferences.

    TIntermTyped* result = base;
    if ((base->isVector() || base->isScalar()) &&
        (base->isFloatingDomain() || base->isIntegerDomain() || base->getBasicType() == EbtBool)) {
        result = handleDotSwizzle(loc, base, field);
    } else if (base->isStruct() || base->isReference()) {
        const TTypeList* fields = base->isReference() ?
                                  base->getType().getReferentType()->getStruct() :
                                  base->getType().getStruct();
        bool fieldFound = false;
        int member;
        for (member = 0; member < (int)fields->size(); ++member) {
            if ((*fields)[member].type->getFieldName() == field) {
                fieldFound = true;
                break;
            }
        }

        if (fieldFound) {
            if (spvVersion.vulkan != 0 && spvVersion.vulkanRelaxed)
                result = vkRelaxedRemapDotDereference(loc, *base, *(*fields)[member].type, field);

            if (result == base)
            {
                if (base->getType().getQualifier().isFrontEndConstant())
                    result = intermediate.foldDereference(base, member, loc);
                else {
                    blockMemberExtensionCheck(loc, base, member, field);
                    TIntermTyped* index = intermediate.addConstantUnion(member, loc);
                    result = intermediate.addIndex(EOpIndexDirectStruct, base, index, loc);
                    result->setType(*(*fields)[member].type);
                    if ((*fields)[member].type->getQualifier().isIo())
                        intermediate.addIoAccessed(field);
                }
            }

            inheritMemoryQualifiers(base->getQualifier(), result->getWritableType().getQualifier());
        } else {
            auto baseSymbol = base;
            while (baseSymbol->getAsSymbolNode() == nullptr) {
                auto binaryNode = baseSymbol->getAsBinaryNode();
                if (binaryNode == nullptr) break;
                baseSymbol = binaryNode->getLeft();
            }
            if (baseSymbol->getAsSymbolNode() != nullptr) {
                TString structName;
                structName.append("\'").append(baseSymbol->getAsSymbolNode()->getName().c_str()).append("\'");
                error(loc, "no such field in structure", field.c_str(), structName.c_str());
            } else {
                error(loc, "no such field in structure", field.c_str(), "");
            }
        }
    } else
        error(loc, "does not apply to this type:", field.c_str(),
          base->getType().getCompleteString(intermediate.getEnhancedMsgs()).c_str());

    // Propagate noContraction up the dereference chain
    if (base->getQualifier().isNoContraction())
        result->getWritableType().getQualifier().setNoContraction();

    // Propagate nonuniform
    if (base->getQualifier().isNonUniform())
        result->getWritableType().getQualifier().nonUniform = true;

    return result;
}